

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

int hash_remove(HashTable *table,void *key)

{
  void *pvVar1;
  uint32 uVar2;
  int iVar3;
  uint32 hash;
  void *data;
  HashItem *prev;
  HashItem *item;
  void *key_local;
  HashTable *table_local;
  
  data = (void *)0x0;
  pvVar1 = table->data;
  uVar2 = calc_hash(table,key);
  prev = table->table[uVar2];
  while( true ) {
    if (prev == (HashItem *)0x0) {
      return 0;
    }
    iVar3 = (*table->keymatch)(key,prev->key,pvVar1);
    if (iVar3 != 0) break;
    data = prev;
    prev = prev->next;
  }
  if (data == (void *)0x0) {
    table->table[uVar2] = prev->next;
  }
  else {
    *(HashItem **)((long)data + 0x10) = prev->next;
  }
  (*table->nuke)(prev->key,prev->value,pvVar1);
  (*table->f)(prev,table->d);
  return 1;
}

Assistant:

int hash_remove(HashTable *table, const void *key)
{
    HashItem *item = NULL;
    HashItem *prev = NULL;
    void *data = table->data;
    const uint32 hash = calc_hash(table, key);
    for (item = table->table[hash]; item != NULL; item = item->next)
    {
        if (table->keymatch(key, item->key, data))
        {
            if (prev != NULL)
                prev->next = item->next;
            else
                table->table[hash] = item->next;

            table->nuke(item->key, item->value, data);
            table->f(item, table->d);
            return 1;
        } // if

        prev = item;
    } // for

    return 0;
}